

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::Solver(Solver *this)

{
  FILE *pFVar1;
  Internal *arg;
  External *this_00;
  Solver *in_RDI;
  char *lidrup_path;
  DeferDeletePtr<CaDiCaL::External> delete_external;
  DeferDeletePtr<CaDiCaL::Internal> delete_internal;
  Internal *in_stack_00000038;
  External *in_stack_00000040;
  char *path;
  Internal *in_stack_00000180;
  char *in_stack_ffffffffffffffa8;
  Solver *in_stack_ffffffffffffffb0;
  char *local_38;
  DeferDeletePtr<CaDiCaL::External> local_30;
  DeferDeletePtr<CaDiCaL::Internal> local_28 [3];
  char *local_10;
  
  local_10 = getenv("CADICAL_API_TRACE");
  if (local_10 == (char *)0x0) {
    local_10 = getenv("CADICALAPITRACE");
  }
  if (local_10 == (char *)0x0) {
    tracing_api_calls_through_environment_variable_method = 0;
    in_RDI->close_trace_api_file = false;
    in_RDI->trace_api_file = (FILE *)0x0;
  }
  else {
    if ((tracing_api_calls_through_environment_variable_method & 1) != 0) {
      fatal(
           "can not trace API calls of two solver instances using environment variable \'CADICAL_API_TRACE\'"
           );
    }
    pFVar1 = fopen(local_10,"w");
    in_RDI->trace_api_file = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      fatal("failed to open file \'%s\' to trace API calls using environment variable \'CADICAL_API_TRACE\'"
            ,local_10);
    }
    in_RDI->close_trace_api_file = true;
    tracing_api_calls_through_environment_variable_method = 1;
  }
  in_RDI->adding_clause = false;
  in_RDI->adding_constraint = false;
  in_RDI->_state = INITIALIZING;
  arg = (Internal *)::operator_new(0x1c78);
  Internal::Internal(in_stack_00000180);
  in_RDI->internal = arg;
  DeferDeletePtr<CaDiCaL::Internal>::DeferDeletePtr(local_28,in_RDI->internal);
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  this_00 = (External *)::operator_new(0x238);
  External::External(in_stack_00000040,in_stack_00000038);
  in_RDI->external = this_00;
  DeferDeletePtr<CaDiCaL::External>::DeferDeletePtr(&local_30,in_RDI->external);
  if (in_RDI->_state != CONFIGURING) {
    in_RDI->_state = CONFIGURING;
  }
  if ((tracing_api_calls_through_environment_variable_method & 1) != 0) {
    message(in_RDI,"tracing API calls to \'%s\'",local_10);
  }
  local_38 = getenv("CADICAL_LIDRUP_TRACE");
  if (local_38 == (char *)0x0) {
    local_38 = getenv("CADICALLIDRUPTRACE");
  }
  if (local_38 != (char *)0x0) {
    set(in_RDI,(char *)arg,(int)((ulong)this_00 >> 0x20));
    set(in_RDI,(char *)arg,(int)((ulong)this_00 >> 0x20));
    trace_proof(in_RDI,(char *)arg);
  }
  tracing_nb_lidrup_env_var_method = local_38 != (char *)0x0;
  DeferDeletePtr<CaDiCaL::Internal>::release(local_28);
  DeferDeletePtr<CaDiCaL::External>::release(&local_30);
  DeferDeletePtr<CaDiCaL::External>::~DeferDeletePtr((DeferDeletePtr<CaDiCaL::External> *)this_00);
  DeferDeletePtr<CaDiCaL::Internal>::~DeferDeletePtr((DeferDeletePtr<CaDiCaL::Internal> *)this_00);
  return;
}

Assistant:

Solver::Solver () {

#ifndef NTRACING
  const char *path = getenv ("CADICAL_API_TRACE");
  if (!path)
    path = getenv ("CADICALAPITRACE");
  if (path) {
    if (tracing_api_calls_through_environment_variable_method)
      FATAL ("can not trace API calls of two solver instances "
             "using environment variable 'CADICAL_API_TRACE'");
    if (!(trace_api_file = fopen (path, "w")))
      FATAL ("failed to open file '%s' to trace API calls "
             "using environment variable 'CADICAL_API_TRACE'",
             path);
    close_trace_api_file = true;
    tracing_api_calls_through_environment_variable_method = true;
  } else {
    tracing_api_calls_through_environment_variable_method = false;
    close_trace_api_file = false;
    trace_api_file = 0;
  }
#endif

  adding_clause = false;
  adding_constraint = false;
  _state = INITIALIZING;
  internal = new Internal ();
  DeferDeletePtr<Internal> delete_internal (internal);
  TRACE ("init");
  external = new External (internal);
  DeferDeletePtr<External> delete_external (external);
  STATE (CONFIGURING);
#ifndef NTRACING
  if (tracing_api_calls_through_environment_variable_method)
    message ("tracing API calls to '%s'", path);
#endif

  const char *lidrup_path = getenv ("CADICAL_LIDRUP_TRACE");
  if (!lidrup_path)
    lidrup_path = getenv ("CADICALLIDRUPTRACE");
  if (lidrup_path) {

    // if (tracing_nb_lidrup_env_var_method)
    // FATAL ("can not trace LIDRUP of two solver instances "
    //   "using environment variable 'CADICAL_LIDRUP_TRACE'");
    // Here we use the solver interface to setup non-binary IDRUP tracing to
    // the defined file. Options set by the user can and will overwrite
    // these settings if neeed be.
    set ("lidrup", 1);
    set ("binary", 0);
    trace_proof (lidrup_path);
    tracing_nb_lidrup_env_var_method = true;
  } else {
    tracing_nb_lidrup_env_var_method = false;
  }

  delete_internal.release ();
  delete_external.release ();
}